

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O1

void __thiscall
KDReports::AutoTableElementPrivate::createHorizontalHeader
          (AutoTableElementPrivate *this,ReportBuilder *builder,QTextDocument *textDoc,
          QTextTable *textTable,int columns,int headerColumnCount)

{
  undefined8 extraout_RAX;
  int section;
  QTextTableCellFormat tableHeaderFormat;
  QTextTableCell cell;
  QTextTableCellFormat local_70 [16];
  long local_60 [2];
  anon_union_24_3_e3d07ef4_for_data local_50;
  
  if ((0 < columns) && (this->m_horizontalHeaderVisible != false)) {
    section = 0;
    do {
      QTextTable::cellAt((int)(QTextCharFormat *)local_60,(int)textTable);
      if (local_60[0] == 0) {
        createHorizontalHeader();
        QVariant::~QVariant((QVariant *)&local_50);
        QTextFormat::~QTextFormat((QTextFormat *)local_70);
        _Unwind_Resume(extraout_RAX);
      }
      QTextTableCellFormat::QTextTableCellFormat(local_70);
      QBrush::operator_cast_to_QVariant((QVariant *)&local_50,&this->m_headerBackground);
      QTextFormat::setProperty((int)local_70,(QVariant *)0x820);
      QVariant::~QVariant((QVariant *)&local_50);
      if ((this->m_horizontalHeaderFormatFunc).super__Function_base._M_manager != (_Manager_type)0x0
         ) {
        local_50._0_4_ = section;
        (*(this->m_horizontalHeaderFormatFunc)._M_invoker)
                  ((_Any_data *)&this->m_horizontalHeaderFormatFunc,(int *)local_50.data,local_70);
      }
      QTextTableCell::setFormat((QTextCharFormat *)local_60);
      fillCellFromHeaderData
                (this,section,Horizontal,(QTextTableCell *)local_60,textDoc,textTable,builder);
      QTextFormat::~QTextFormat((QTextFormat *)local_70);
      section = section + 1;
    } while (columns != section);
  }
  return;
}

Assistant:

void KDReports::AutoTableElementPrivate::createHorizontalHeader(ReportBuilder &builder, QTextDocument &textDoc, QTextTable *textTable, int columns, int headerColumnCount) const
{
    if (m_horizontalHeaderVisible) {
        for (int column = 0; column < columns; column++) {
            QTextTableCell cell = textTable->cellAt(0, column + headerColumnCount);
            Q_ASSERT(cell.isValid());
            QTextTableCellFormat tableHeaderFormat;
            tableHeaderFormat.setBackground(m_headerBackground);
            if (m_horizontalHeaderFormatFunc)
                m_horizontalHeaderFormatFunc(column, tableHeaderFormat);
            cell.setFormat(tableHeaderFormat);
            fillCellFromHeaderData(column, Qt::Horizontal, cell, textDoc, textTable, builder);
        }
    }
}